

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkAttachmentReference2 *att,MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,
               Value *out_value)

{
  bool bVar1;
  bool bVar2;
  Value value;
  Value nexts;
  Data local_78;
  Data local_68;
  Data local_58;
  StringRefType local_40;
  
  local_78.n.i64 = (Number)0x0;
  local_78.s.str = (Ch *)0x3000000000000;
  local_58._4_1_ = '\0';
  local_58._5_1_ = '\0';
  local_58._6_1_ = '\0';
  local_58._7_1_ = '\0';
  local_58._0_4_ = att->attachment;
  local_68.s.str = (Ch *)0x4050000002e8696;
  local_68.n = (Number)0xa;
  local_58.s.str = (Ch *)((ulong)(-1 < (int)att->attachment) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,alloc);
  local_40.s = "layout";
  local_40.length = 6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<VkImageLayout>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_78.s,&local_40,att->layout,alloc);
  local_58._4_1_ = '\0';
  local_58._5_1_ = '\0';
  local_58._6_1_ = '\0';
  local_58._7_1_ = '\0';
  local_58._0_4_ = att->aspectMask;
  local_68.s.str = (Ch *)0x4050000002e7c40;
  local_68.n = (Number)0xa;
  local_58.s.str = (Ch *)((ulong)(-1 < (int)att->aspectMask) << 0x35 | 0x1d6000000000000);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_78.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_68.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_58.s,alloc);
  bVar1 = true;
  if (att->pNext != (void *)0x0) {
    local_68.n = (Number)0x0;
    local_68.s.str = (Ch *)0x0;
    bVar2 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (att->pNext,alloc,(Value *)&local_68.s,(DynamicStateInfo *)0x0);
    if (bVar2) {
      local_58.s.str = (Ch *)0x4050000002e7b06;
      local_58.n = (Number)0x5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_78.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_58.s,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_68.s,alloc);
    }
    else {
      bVar1 = false;
    }
  }
  if (!(bool)(bVar1 ^ 1U | &local_78 == &out_value->data_)) {
    (out_value->data_).n = local_78.n;
    (out_value->data_).s.str = local_78.s.str;
  }
  return bVar1;
}

Assistant:

static bool json_value(const VkAttachmentReference2 &att, Allocator &alloc, Value *out_value)
{
	Value value(kObjectType);
	value.AddMember("attachment", att.attachment, alloc);
	value.AddMember("layout", att.layout, alloc);
	value.AddMember("aspectMask", att.aspectMask, alloc);
	if (!pnext_chain_add_json_value(value, att, alloc, nullptr))
		return false;

	*out_value = value;
	return true;
}